

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::OptionException::OptionException(OptionException *this,string *message)

{
  string *message_local;
  OptionException *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__OptionException_0019b100;
  std::__cxx11::string::string((string *)&this->m_message,(string *)message);
  return;
}

Assistant:

OptionException(const std::string& message)
    : m_message(message)
    {
    }